

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

int32_t icu_63::CalendarCache::get(CalendarCache **cache,int32_t key,UErrorCode *status)

{
  UBool UVar1;
  int32_t res;
  UErrorCode *status_local;
  int32_t key_local;
  CalendarCache **cache_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    umtx_lock_63(&ccLock);
    if (*cache == (CalendarCache *)0x0) {
      createCache(cache,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        umtx_unlock_63(&ccLock);
        return 0;
      }
    }
    cache_local._4_4_ = uhash_igeti_63((*cache)->fTable,key);
    umtx_unlock_63(&ccLock);
  }
  else {
    cache_local._4_4_ = 0;
  }
  return cache_local._4_4_;
}

Assistant:

int32_t CalendarCache::get(CalendarCache** cache, int32_t key, UErrorCode &status) {
    int32_t res;

    if(U_FAILURE(status)) {
        return 0;
    }
    umtx_lock(&ccLock);

    if(*cache == NULL) {
        createCache(cache, status);
        if(U_FAILURE(status)) {
            umtx_unlock(&ccLock);
            return 0;
        }
    }

    res = uhash_igeti((*cache)->fTable, key);
    U_DEBUG_ASTRO_MSG(("%p: GET: [%d] == %d\n", (*cache)->fTable, key, res));

    umtx_unlock(&ccLock);
    return res;
}